

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall
cppcms::application::render(application *this,string *template_name,base_content *content)

{
  bool bVar1;
  manager *this_00;
  context *pcVar2;
  response *this_01;
  ostream *out;
  app_guard g;
  app_guard local_48;
  string local_40;
  
  local_48.p_ = (base_content *)0x0;
  bVar1 = base_content::has_app(content);
  if (!bVar1) {
    local_48.p_ = content;
    base_content::app(content,this);
  }
  this_00 = cppcms::service::views_pool(((this->d).ptr_)->service);
  pcVar2 = context(this);
  http::context::skin_abi_cxx11_(&local_40,pcVar2);
  pcVar2 = context(this);
  this_01 = http::context::response(pcVar2);
  out = http::response::out(this_01);
  views::manager::render(this_00,&local_40,template_name,out,content);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  base_content::app_guard::~app_guard(&local_48);
  return;
}

Assistant:

void application::render(std::string template_name,base_content &content)
{
	base_content::app_guard g(content,*this);
	service().views_pool().render(context().skin(),template_name,response().out(),content);
}